

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O2

BlurNode * rengine::BlurNode::create(void)

{
  undefined1 *puVar1;
  BlurNode *this;
  
  if (__allocation_pool_rengine_BlurNode.m_nextFree < __allocation_pool_rengine_BlurNode.m_poolSize)
  {
    this = AllocationPool<rengine::BlurNode>::allocate(&__allocation_pool_rengine_BlurNode);
    puVar1 = &(this->super_Node).field_0x31;
    *puVar1 = *puVar1 | 2;
  }
  else {
    this = (BlurNode *)operator_new(0x38);
    BlurNode(this);
  }
  return this;
}

Assistant:

static BlurNode *create(unsigned radius) {
        auto node = create();
        node->setRadius(radius);
        return node;
    }